

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     resize_if_allowed<Eigen::Matrix<double,_1,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,3,1>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,_1,1,false>const>,double,double>
               (Matrix<double,__1,_1,_0,_3,_1> *dst,
               CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>
               *src,assign_op<double,_double> *param_3)

{
  Index IVar1;
  Index cols;
  Index IVar2;
  bool bVar3;
  Index dstCols;
  Index dstRows;
  assign_op<double,_double> *param_2_local;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>
  *src_local;
  Matrix<double,__1,_1,_0,_3,_1> *dst_local;
  
  IVar1 = CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_-1,_1,_false>_>
          ::rows(src);
  cols = CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_-1,_1,_false>_>
         ::cols(src);
  IVar2 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>_>::rows
                    (&dst->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>);
  if (IVar2 == IVar1) {
    IVar2 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>_>::cols
                      (&dst->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>);
    if (IVar2 == cols) goto LAB_0015ec7d;
  }
  PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>_>::resize
            (&dst->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,IVar1,cols);
LAB_0015ec7d:
  IVar2 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>_>::rows
                    (&dst->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>);
  bVar3 = false;
  if (IVar2 == IVar1) {
    IVar1 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>_>::cols
                      (&dst->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>);
    bVar3 = IVar1 == cols;
  }
  if (!bVar3) {
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/AssignEvaluator.h"
                  ,0x2fd,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1, 0, 3, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>, const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 3, 3>, 3, 1, true>, -1, 1>>, T1 = double, T2 = double]"
                 );
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void resize_if_allowed(DstXprType &dst, const SrcXprType& src, const internal::assign_op<T1,T2> &/*func*/)
{
  Index dstRows = src.rows();
  Index dstCols = src.cols();
  if(((dst.rows()!=dstRows) || (dst.cols()!=dstCols)))
    dst.resize(dstRows, dstCols);
  eigen_assert(dst.rows() == dstRows && dst.cols() == dstCols);
}